

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

bool __thiscall QAccessibleTable::unselectColumn(QAccessibleTable *this,int column)

{
  char cVar1;
  SelectionMode SVar2;
  int iVar3;
  QAbstractItemView *pQVar4;
  QAbstractItemModel *pQVar5;
  QItemSelectionModel *pQVar6;
  QAbstractItemModel *pQVar7;
  bool bVar8;
  long in_FS_OFFSET;
  QModelIndex local_c8;
  QArrayDataPointer<QItemSelectionRange> local_b0;
  QArrayDataPointer<QItemSelectionRange> local_98;
  QModelIndex local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (QAbstractItemView *)view(this);
  pQVar5 = QAbstractItemView::model(pQVar4);
  pQVar6 = QAbstractItemView::selectionModel(pQVar4);
  if (pQVar6 == (QItemSelectionModel *)0x0 || pQVar5 == (QAbstractItemModel *)0x0) {
    bVar8 = false;
    goto LAB_004da74c;
  }
  local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::rootIndex(&local_58,pQVar4);
  local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = (QAbstractItemView *)view(this);
  pQVar7 = QAbstractItemView::model(pQVar4);
  (**(code **)(*(long *)pQVar7 + 0x60))(&local_78,pQVar7,0,column,&local_58);
  bVar8 = false;
  if (((local_78.r < 0) || (bVar8 = false, (long)local_78._0_8_ < 0)) ||
     (local_78.m.ptr == (QAbstractItemModel *)0x0)) goto LAB_004da74c;
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelection::QItemSelection((QItemSelection *)&local_98,&local_78,&local_78);
  pQVar4 = (QAbstractItemView *)view(this);
  SVar2 = QAbstractItemView::selectionMode(pQVar4);
  if (SVar2 == ContiguousSelection) {
    iVar3 = (**(code **)(*(long *)this + 0x48))(this);
    if (iVar3 == 1) goto LAB_004da699;
    if (((column == 0) ||
        (cVar1 = QItemSelectionModel::isColumnSelected
                           ((int)pQVar6,(QModelIndex *)(ulong)(column - 1)), cVar1 != '\0')) &&
       (cVar1 = QItemSelectionModel::isColumnSelected
                          ((int)pQVar6,(QModelIndex *)(ulong)(column + 1)), cVar1 != '\0')) {
      iVar3 = (**(code **)(*(long *)this + 0x58))(this);
      (**(code **)(*(long *)pQVar5 + 0x60))(&local_c8,pQVar5,0,iVar3 + -1,&local_58);
      QItemSelection::QItemSelection((QItemSelection *)&local_b0,&local_78,&local_c8);
      QArrayDataPointer<QItemSelectionRange>::operator=(&local_98,&local_b0);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_b0);
    }
LAB_004da72e:
    (**(code **)(*(long *)pQVar6 + 0x70))(pQVar6,&local_98,0x44);
    bVar8 = true;
  }
  else {
    if ((SVar2 != SingleSelection) ||
       (iVar3 = (**(code **)(*(long *)this + 0x48))(this), iVar3 != 1)) goto LAB_004da72e;
LAB_004da699:
    bVar8 = false;
  }
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_98);
LAB_004da74c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool QAccessibleTable::unselectColumn(int column)
{
    const QAbstractItemView *theView = view();
    const QAbstractItemModel *theModel = theView->model();
    auto *selectionModel = theView->selectionModel();
    if (!theModel || !selectionModel)
        return false;

    const QModelIndex rootIndex = theView->rootIndex();
    const QModelIndex index = view()->model()->index(0, column, rootIndex);
    if (!index.isValid())
        return false;

    QItemSelection selection(index, index);

    switch (view()->selectionMode()) {
    case QAbstractItemView::SingleSelection:
        //In SingleSelection and ContiguousSelection once an item
        //is selected, there's no way for the user to unselect all items
        if (selectedColumnCount() == 1)
            return false;
        break;
    case QAbstractItemView::ContiguousSelection:
        if (selectedColumnCount() == 1)
            return false;

        if ((!column || selectionModel->isColumnSelected(column - 1, rootIndex))
            && selectionModel->isColumnSelected(column + 1, rootIndex)) {
            //If there are columns selected both at the left of the current row and at the right
            //of the current rown, the ones which are at the right will be deselected
            selection = QItemSelection(index, theModel->index(0, columnCount() - 1, rootIndex));
        }
        break;
    default:
        break;
    }

    selectionModel->select(selection, QItemSelectionModel::Deselect | QItemSelectionModel::Columns);
    return true;
}